

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

wstring_view __thiscall mjs::ltrim(mjs *this,wstring_view s,version ver)

{
  size_type sVar1;
  const_reference pvVar2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar3;
  wstring_view wVar4;
  bool local_39;
  ulong local_38;
  size_t start_pos;
  undefined1 auStack_28 [4];
  version ver_local;
  wstring_view s_local;
  
  s_local._M_len = s._M_len;
  local_38 = 0;
  _auStack_28 = this;
  while( true ) {
    sVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28);
    local_39 = false;
    if (local_38 < sVar1) {
      pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28,
                          local_38);
      local_39 = is_whitespace_or_line_terminator((char16_t)*pvVar2,(version)s._M_str);
    }
    if (local_39 == false) break;
    local_38 = local_38 + 1;
  }
  bVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28,local_38,
                     0xffffffffffffffff);
  wVar4._M_len = bVar3._M_len;
  wVar4._M_str = bVar3._M_str;
  return wVar4;
}

Assistant:

std::wstring_view ltrim(std::wstring_view s, version ver) {
    size_t start_pos = 0;
    while (start_pos < s.length() && is_whitespace_or_line_terminator(s[start_pos], ver)) {
        ++start_pos;
    }
    return s.substr(start_pos);
}